

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-text.cpp
# Opt level: O1

bool ImTui_ImplText_Init(void)

{
  ImGuiStyle *pIVar1;
  ImGuiIO *pIVar2;
  int tex_h;
  int tex_w;
  uchar *tex_pixels;
  ImFontConfig fontConfig;
  int iStack_b8;
  int local_b4;
  uchar *local_b0;
  ImFontConfig local_a8;
  
  pIVar1 = ImGui::GetStyle();
  pIVar1->Alpha = 1.0;
  pIVar1 = ImGui::GetStyle();
  (pIVar1->WindowPadding).x = 0.5;
  (pIVar1->WindowPadding).y = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->WindowRounding = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->WindowBorderSize = 0.0;
  pIVar1 = ImGui::GetStyle();
  (pIVar1->WindowMinSize).x = 4.0;
  (pIVar1->WindowMinSize).y = 2.0;
  pIVar1 = ImGui::GetStyle();
  (pIVar1->WindowTitleAlign).x = 0.0;
  (pIVar1->WindowTitleAlign).y = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->WindowMenuButtonPosition = 0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->ChildRounding = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->ChildBorderSize = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->PopupRounding = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->PopupBorderSize = 0.0;
  pIVar1 = ImGui::GetStyle();
  (pIVar1->FramePadding).x = 1.0;
  (pIVar1->FramePadding).y = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->FrameRounding = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->FrameBorderSize = 0.0;
  pIVar1 = ImGui::GetStyle();
  (pIVar1->ItemSpacing).x = 1.0;
  (pIVar1->ItemSpacing).y = 0.0;
  pIVar1 = ImGui::GetStyle();
  (pIVar1->ItemInnerSpacing).x = 1.0;
  (pIVar1->ItemInnerSpacing).y = 0.0;
  pIVar1 = ImGui::GetStyle();
  (pIVar1->TouchExtraPadding).x = 0.5;
  (pIVar1->TouchExtraPadding).y = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->IndentSpacing = 1.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->ColumnsMinSpacing = 1.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->ScrollbarSize = 0.5;
  pIVar1 = ImGui::GetStyle();
  pIVar1->ScrollbarRounding = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->GrabMinSize = 0.1;
  pIVar1 = ImGui::GetStyle();
  pIVar1->GrabRounding = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->TabRounding = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->TabBorderSize = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->ColorButtonPosition = 1;
  pIVar1 = ImGui::GetStyle();
  (pIVar1->ButtonTextAlign).x = 0.5;
  (pIVar1->ButtonTextAlign).y = 0.0;
  pIVar1 = ImGui::GetStyle();
  (pIVar1->SelectableTextAlign).x = 0.0;
  (pIVar1->SelectableTextAlign).y = 0.0;
  pIVar1 = ImGui::GetStyle();
  (pIVar1->DisplayWindowPadding).x = 0.0;
  (pIVar1->DisplayWindowPadding).y = 0.0;
  pIVar1 = ImGui::GetStyle();
  (pIVar1->DisplaySafeAreaPadding).x = 0.0;
  (pIVar1->DisplaySafeAreaPadding).y = 0.0;
  pIVar1 = ImGui::GetStyle();
  (pIVar1->CellPadding).x = 1.0;
  (pIVar1->CellPadding).y = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->MouseCursorScale = 1.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->AntiAliasedLines = false;
  pIVar1 = ImGui::GetStyle();
  pIVar1->AntiAliasedFill = false;
  pIVar1 = ImGui::GetStyle();
  pIVar1->CurveTessellationTol = 1.25;
  pIVar1 = ImGui::GetStyle();
  pIVar1->Colors[2].x = 0.15;
  pIVar1->Colors[2].y = 0.15;
  pIVar1->Colors[2].z = 0.15;
  pIVar1->Colors[2].w = 1.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->Colors[10].x = 0.35;
  pIVar1->Colors[10].y = 0.35;
  pIVar1->Colors[10].z = 0.35;
  pIVar1->Colors[10].w = 1.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->Colors[0xc].x = 0.15;
  pIVar1->Colors[0xc].y = 0.15;
  pIVar1->Colors[0xc].z = 0.15;
  pIVar1->Colors[0xc].w = 1.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->Colors[0x2f].x = 0.75;
  pIVar1->Colors[0x2f].y = 0.75;
  pIVar1->Colors[0x2f].z = 0.75;
  pIVar1->Colors[0x2f].w = 0.5;
  pIVar1 = ImGui::GetStyle();
  pIVar1->Colors[0x31].x = 0.0;
  pIVar1->Colors[0x31].y = 0.0;
  pIVar1->Colors[0x31].z = 0.0;
  pIVar1->Colors[0x31].w = 0.0;
  ImFontConfig::ImFontConfig(&local_a8);
  local_a8.GlyphMinAdvanceX = 1.0;
  local_a8.SizePixels = 1.0;
  pIVar2 = ImGui::GetIO();
  ImFontAtlas::AddFontDefault(pIVar2->Fonts,&local_a8);
  local_b0 = (uchar *)0x0;
  pIVar2 = ImGui::GetIO();
  ImFontAtlas::GetTexDataAsRGBA32(pIVar2->Fonts,&local_b0,&local_b4,&iStack_b8,(int *)0x0);
  return true;
}

Assistant:

bool ImTui_ImplText_Init() {
    ImGui::GetStyle().Alpha                   = 1.0f;
    ImGui::GetStyle().WindowPadding           = ImVec2(0.5f, 0.0f);
    ImGui::GetStyle().WindowRounding          = 0.0f;
    ImGui::GetStyle().WindowBorderSize        = 0.0f;
    ImGui::GetStyle().WindowMinSize           = ImVec2(4.0f, 2.0f);
    ImGui::GetStyle().WindowTitleAlign        = ImVec2(0.0f, 0.0f);
    ImGui::GetStyle().WindowMenuButtonPosition= ImGuiDir_Left;
    ImGui::GetStyle().ChildRounding           = 0.0f;
    ImGui::GetStyle().ChildBorderSize         = 0.0f;
    ImGui::GetStyle().PopupRounding           = 0.0f;
    ImGui::GetStyle().PopupBorderSize         = 0.0f;
    ImGui::GetStyle().FramePadding            = ImVec2(1.0f, 0.0f);
    ImGui::GetStyle().FrameRounding           = 0.0f;
    ImGui::GetStyle().FrameBorderSize         = 0.0f;
    ImGui::GetStyle().ItemSpacing             = ImVec2(1.0f, 0.0f);
    ImGui::GetStyle().ItemInnerSpacing        = ImVec2(1.0f, 0.0f);
    ImGui::GetStyle().TouchExtraPadding       = ImVec2(0.5f, 0.0f);
    ImGui::GetStyle().IndentSpacing           = 1.0f;
    ImGui::GetStyle().ColumnsMinSpacing       = 1.0f;
    ImGui::GetStyle().ScrollbarSize           = 0.5f;
    ImGui::GetStyle().ScrollbarRounding       = 0.0f;
    ImGui::GetStyle().GrabMinSize             = 0.1f;
    ImGui::GetStyle().GrabRounding            = 0.0f;
    ImGui::GetStyle().TabRounding             = 0.0f;
    ImGui::GetStyle().TabBorderSize           = 0.0f;
    ImGui::GetStyle().ColorButtonPosition     = ImGuiDir_Right;
    ImGui::GetStyle().ButtonTextAlign         = ImVec2(0.5f,0.0f);
    ImGui::GetStyle().SelectableTextAlign     = ImVec2(0.0f,0.0f);
    ImGui::GetStyle().DisplayWindowPadding    = ImVec2(0.0f,0.0f);
    ImGui::GetStyle().DisplaySafeAreaPadding  = ImVec2(0.0f,0.0f);
    ImGui::GetStyle().CellPadding             = ImVec2(1.0f,0.0f);
    ImGui::GetStyle().MouseCursorScale        = 1.0f;
    ImGui::GetStyle().AntiAliasedLines        = false;
    ImGui::GetStyle().AntiAliasedFill         = false;
    ImGui::GetStyle().CurveTessellationTol    = 1.25f;

    ImGui::GetStyle().Colors[ImGuiCol_WindowBg]         = ImVec4(0.15, 0.15, 0.15, 1.0f);
    ImGui::GetStyle().Colors[ImGuiCol_TitleBg]          = ImVec4(0.35, 0.35, 0.35, 1.0f);
    ImGui::GetStyle().Colors[ImGuiCol_TitleBgCollapsed] = ImVec4(0.15, 0.15, 0.15, 1.0f);
    ImGui::GetStyle().Colors[ImGuiCol_TextSelectedBg]   = ImVec4(0.75, 0.75, 0.75, 0.5f);
    ImGui::GetStyle().Colors[ImGuiCol_NavHighlight]     = ImVec4(0.00, 0.00, 0.00, 0.0f);

    ImFontConfig fontConfig;
    fontConfig.GlyphMinAdvanceX = 1.0f;
    fontConfig.SizePixels = 1.00;
    ImGui::GetIO().Fonts->AddFontDefault(&fontConfig);

    // Build atlas
    unsigned char* tex_pixels = NULL;
    int tex_w, tex_h;
    ImGui::GetIO().Fonts->GetTexDataAsRGBA32(&tex_pixels, &tex_w, &tex_h);

    return true;
}